

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O0

bool cmIncludeGuardCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference __lhs;
  cmMakefile *this;
  string *filePath;
  cmValue local_f0;
  cmake *local_e8;
  cmake *cm;
  cmMakefile *local_d8;
  cmMakefile *mf;
  string local_c8;
  cmValue local_a8;
  undefined1 local_a0 [8];
  string includeGuardVar;
  string *arg;
  IncludeGuardScope scope;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar3 < 2) {
    arg._0_4_ = 0;
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
    if (!bVar2) {
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,0);
      bVar2 = std::operator==(__lhs,"DIRECTORY");
      if (bVar2) {
        arg._0_4_ = 1;
      }
      else {
        bVar2 = std::operator==(__lhs,"GLOBAL");
        pcVar1 = local_20;
        if (!bVar2) {
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&includeGuardVar.field_2 + 8);
          std::operator+(__return_storage_ptr__,"given an invalid scope: ",__lhs);
          cmExecutionStatus::SetError(pcVar1,__return_storage_ptr__);
          std::__cxx11::string::~string((string *)(includeGuardVar.field_2._M_local_buf + 8));
          args_local._7_1_ = 0;
          goto LAB_00416dff;
        }
        arg._0_4_ = 2;
      }
    }
    this = cmExecutionStatus::GetMakefile(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)((long)&mf + 7));
    local_a8 = cmMakefile::GetDefinition(this,&local_c8);
    filePath = cmValue::operator*[abi_cxx11_(&local_a8);
    anon_unknown.dwarf_630c1c::GetIncludeGuardVariableName((string *)local_a0,filePath);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
    local_d8 = cmExecutionStatus::GetMakefile(local_20);
    if ((int)arg == 0) {
      bVar2 = cmMakefile::IsDefinitionSet(local_d8,(string *)local_a0);
      if (bVar2) {
        cmExecutionStatus::SetReturnInvoked(local_20);
      }
      else {
        cmMakefile::AddDefinitionBool(local_d8,(string *)local_a0,true);
      }
    }
    else if ((int)arg == 1) {
      bVar2 = anon_unknown.dwarf_630c1c::CheckIncludeGuardIsSet(local_d8,(string *)local_a0);
      if (bVar2) {
        cmExecutionStatus::SetReturnInvoked(local_20);
      }
      else {
        cmMakefile::SetProperty(local_d8,(string *)local_a0,"TRUE");
      }
    }
    else if ((int)arg == 2) {
      local_e8 = cmMakefile::GetCMakeInstance(local_d8);
      local_f0 = cmake::GetProperty(local_e8,(string *)local_a0);
      bVar2 = cmValue::operator_cast_to_bool(&local_f0);
      if (bVar2) {
        cmExecutionStatus::SetReturnInvoked(local_20);
      }
      else {
        cmake::SetProperty(local_e8,(string *)local_a0,"TRUE");
      }
    }
    args_local._7_1_ = 1;
    cm._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "given an invalid number of arguments. The command takes at most 1 argument.",
               &local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
LAB_00416dff:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmIncludeGuardCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() > 1) {
    status.SetError(
      "given an invalid number of arguments. The command takes at "
      "most 1 argument.");
    return false;
  }

  IncludeGuardScope scope = VARIABLE;

  if (!args.empty()) {
    std::string const& arg = args[0];
    if (arg == "DIRECTORY") {
      scope = DIRECTORY;
    } else if (arg == "GLOBAL") {
      scope = GLOBAL;
    } else {
      status.SetError("given an invalid scope: " + arg);
      return false;
    }
  }

  std::string includeGuardVar = GetIncludeGuardVariableName(
    *status.GetMakefile().GetDefinition("CMAKE_CURRENT_LIST_FILE"));

  cmMakefile* const mf = &status.GetMakefile();

  switch (scope) {
    case VARIABLE:
      if (mf->IsDefinitionSet(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->AddDefinitionBool(includeGuardVar, true);
      break;
    case DIRECTORY:
      if (CheckIncludeGuardIsSet(mf, includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->SetProperty(includeGuardVar, "TRUE");
      break;
    case GLOBAL:
      cmake* const cm = mf->GetCMakeInstance();
      if (cm->GetProperty(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      cm->SetProperty(includeGuardVar, "TRUE");
      break;
  }

  return true;
}